

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_client.cpp
# Opt level: O2

int __thiscall miniros::ServiceClient::Impl::shutdown(Impl *this,int __fd,int __how)

{
  int extraout_EAX;
  element_type *in_RAX;
  
  if (this->is_shutdown_ == false) {
    if (this->persistent_ == false) {
      this->is_shutdown_ = true;
    }
    in_RAX = (this->server_link_).
             super___shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (in_RAX != (element_type *)0x0) {
      Connection::drop((in_RAX->connection_).
                       super___shared_ptr<miniros::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       Destructing);
      std::__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2>::reset
                ((__shared_ptr<miniros::ServiceServerLink,_(__gnu_cxx::_Lock_policy)2> *)this);
      return extraout_EAX;
    }
  }
  return (int)in_RAX;
}

Assistant:

void ServiceClient::Impl::shutdown()
{
  if (!is_shutdown_)
  {
    if (!persistent_)
    {
      is_shutdown_ = true;
    }

    if (server_link_)
    {
      server_link_->getConnection()->drop(Connection::Destructing);
      server_link_.reset();
    }
  }
}